

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx
          (value_type *__return_storage_ptr__,
          FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this,int i)

{
  Fad<Fad<double>_> *pFVar1;
  Fad<Fad<double>_> *pFVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_58;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_48;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_38;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_28;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_18;
  
  local_18.fadexpr_.right_ = &local_58;
  pFVar1 = this->left_;
  pFVar2 = this->right_;
  local_38.fadexpr_.left_ = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    local_38.fadexpr_.left_ = (pFVar1->dx_).ptr_to_data + i;
  }
  local_58.fadexpr_.left_ = &pFVar2->val_;
  local_28.fadexpr_.left_ = &local_38;
  local_48.fadexpr_.left_ = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    local_48.fadexpr_.left_ = (pFVar2->dx_).ptr_to_data + i;
  }
  local_48.fadexpr_.right_ = &pFVar1->val_;
  local_28.fadexpr_.right_ = &local_48;
  local_18.fadexpr_.left_ = &local_28;
  local_58.fadexpr_.right_ = local_58.fadexpr_.left_;
  local_38.fadexpr_.right_ = local_58.fadexpr_.left_;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}